

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::ReadListFile(cmMakefile *this,char *filename)

{
  bool bVar1;
  bool bVar2;
  char *in_base;
  cmMessenger *messenger;
  cmListFile listFile;
  ListFileScope scope;
  string filenametoread;
  string local_68;
  ListFileScope local_48;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_68,filename,(allocator *)&local_48);
  in_base = GetCurrentSourceDirectory(this);
  cmsys::SystemTools::CollapseFullPath(&local_38,&local_68,in_base);
  std::__cxx11::string::~string((string *)&local_68);
  ListFileScope::ListFileScope(&local_48,this,&local_38);
  local_68._M_dataplus._M_p = (pointer)0x0;
  local_68._M_string_length = 0;
  local_68.field_2._M_allocated_capacity = 0;
  messenger = GetMessenger(this);
  bVar1 = cmListFile::ParseFile
                    ((cmListFile *)&local_68,local_38._M_dataplus._M_p,messenger,&this->Backtrace);
  if (bVar1) {
    ReadListFile(this,(cmListFile *)&local_68,&local_38);
    bVar2 = cmSystemTools::GetFatalErrorOccured();
    if (bVar2) {
      local_48.ReportError = false;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)&local_68);
  ListFileScope::~ListFileScope(&local_48);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool cmMakefile::ReadListFile(const char* filename)
{
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    filename, this->GetCurrentSourceDirectory());

  ListFileScope scope(this, filenametoread);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return false;
  }

  this->ReadListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccured()) {
    scope.Quiet();
  }
  return true;
}